

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O0

long go(void)

{
  allocator<int> *paVar1;
  allocator<std::vector<int,_std::allocator<int>_>_> *this;
  allocator<CalculationResult> *this_00;
  allocator<PixelColor> *this_01;
  int iVar2;
  int iVar3;
  int in_ECX;
  Section *in_RDX;
  ImageSize *in_RSI;
  tuple<std::vector<PixelColor,_std::allocator<PixelColor>_>,_std::vector<double,_std::allocator<double>_>_>
  *in_RDI;
  Gradient *in_R8;
  int in_R9D;
  int in_stack_00000008;
  duration<long,_std::ratio<1L,_1000000000L>_> local_130;
  duration<double,_std::ratio<1L,_1L>_> local_128;
  rep_conflict local_120;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_118;
  time_point t2;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> threads;
  time_point t1;
  undefined1 local_e8 [4];
  int i;
  vector<double,_std::allocator<double>_> durations;
  undefined1 local_c8 [8];
  vector<PixelColor,_std::allocator<PixelColor>_> image_data;
  undefined1 local_a8 [8];
  vector<CalculationResult,_std::allocator<CalculationResult>_> results_per_point;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> combined_iterations_histogram;
  vector<int,_std::allocator<int>_> local_68;
  undefined1 local_50 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  iteration_histograms_per_thread;
  int repetitions_local;
  Gradient *gradient_local;
  int max_iterations_local;
  Section *section_local;
  ImageSize *image_local;
  
  paVar1 = (allocator<int> *)
           ((long)&combined_iterations_histogram.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  iteration_histograms_per_thread.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = in_R9D;
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector(&local_68,(long)(in_ECX + 1),paVar1);
  this = (allocator<std::vector<int,_std::allocator<int>_>_> *)
         ((long)&combined_iterations_histogram.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(this);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_50,(long)in_stack_00000008,&local_68,this);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&combined_iterations_histogram.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::vector<int,_std::allocator<int>_>::~vector(&local_68);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&combined_iterations_histogram.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<int> *)
           ((long)&results_per_point.
                   super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,(long)(in_ECX + 1),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&results_per_point.
                     super__Vector_base<CalculationResult,_std::allocator<CalculationResult>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = in_RSI->width;
  iVar3 = in_RSI->height;
  this_00 = (allocator<CalculationResult> *)
            ((long)&image_data.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<CalculationResult>::allocator(this_00);
  std::vector<CalculationResult,_std::allocator<CalculationResult>_>::vector
            ((vector<CalculationResult,_std::allocator<CalculationResult>_> *)local_a8,
             (long)(iVar2 * iVar3),this_00);
  std::allocator<CalculationResult>::~allocator
            ((allocator<CalculationResult> *)
             ((long)&image_data.super__Vector_base<PixelColor,_std::allocator<PixelColor>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = in_RSI->width;
  iVar3 = in_RSI->height;
  this_01 = (allocator<PixelColor> *)
            ((long)&durations.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<PixelColor>::allocator(this_01);
  std::vector<PixelColor,_std::allocator<PixelColor>_>::vector
            ((vector<PixelColor,_std::allocator<PixelColor>_> *)local_c8,(long)(iVar2 * iVar3),
             this_01);
  std::allocator<PixelColor>::~allocator
            ((allocator<PixelColor> *)
             ((long)&durations.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_e8);
  for (t1.__d.__r._4_4_ = 0;
      t1.__d.__r._4_4_ <
      iteration_histograms_per_thread.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      t1.__d.__r._4_4_ = t1.__d.__r._4_4_ + 1) {
    threads.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)std::chrono::_V2::system_clock::now();
    start_threads((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&t2,in_RSI,
                  in_RDX,in_ECX,
                  (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_50,
                  (vector<CalculationResult,_std::allocator<CalculationResult>_> *)local_a8,
                  in_stack_00000008);
    wait_for_threads_to_finish
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&t2);
    combine_iteration_histograms
              ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)local_50,(vector<int,_std::allocator<int>_> *)local_88);
    mandelbrot_colorize(in_ECX,in_R8,(vector<PixelColor,_std::allocator<PixelColor>_> *)local_c8,
                        (vector<int,_std::allocator<int>_> *)local_88,
                        (vector<CalculationResult,_std::allocator<CalculationResult>_> *)local_a8);
    local_118.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_130.__r =
         (rep)std::chrono::operator-
                        (&local_118,
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&threads.
                             super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_128,&local_130);
    local_120 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_128);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_e8,&local_120);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&t2);
  }
  std::
  make_tuple<std::vector<PixelColor,std::allocator<PixelColor>>&,std::vector<double,std::allocator<double>>&>
            (in_RDI,(vector<PixelColor,_std::allocator<PixelColor>_> *)local_c8,
             (vector<double,_std::allocator<double>_> *)local_e8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_e8);
  std::vector<PixelColor,_std::allocator<PixelColor>_>::~vector
            ((vector<PixelColor,_std::allocator<PixelColor>_> *)local_c8);
  std::vector<CalculationResult,_std::allocator<CalculationResult>_>::~vector
            ((vector<CalculationResult,_std::allocator<CalculationResult>_> *)local_a8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_50);
  return (long)in_RDI;
}

Assistant:

auto go(const ImageSize& image, const Section& section, const int max_iterations, const Gradient& gradient, const int repetitions, const int num_threads) noexcept
{
    // iterations_histogram: for simplicity we only use indices [1] .. [max_iterations], [0] is unused
    std::vector<std::vector<int>> iteration_histograms_per_thread(static_cast<std::size_t>(num_threads), std::vector<int>(static_cast<std::size_t>(max_iterations + 1)));
    std::vector<int> combined_iterations_histogram(static_cast<std::size_t>(max_iterations + 1));

    // For every point store a tuple consisting of the final iteration and (for escaped points)
    // the distance to the next iteration (as value of 0.0 .. 1.0).
    std::vector<CalculationResult> results_per_point(static_cast<std::size_t>(image.width * image.height));

    std::vector<PixelColor> image_data(static_cast<std::size_t>(image.width * image.height));
    std::vector<double> durations;

    for (int i = 0; i < repetitions; ++i) {
        const auto t1 = std::chrono::high_resolution_clock::now();

        auto threads = start_threads(image, section, max_iterations, iteration_histograms_per_thread, results_per_point, num_threads);
        wait_for_threads_to_finish(threads);
        combine_iteration_histograms(iteration_histograms_per_thread, combined_iterations_histogram);
        mandelbrot_colorize(max_iterations, gradient, image_data, combined_iterations_histogram, results_per_point);

        const auto t2 = std::chrono::high_resolution_clock::now();
        durations.push_back(std::chrono::duration<double>{t2 - t1}.count());
    }

    return std::make_tuple(image_data, durations);
}